

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void __thiscall
TPZSkylMatrix<std::complex<float>_>::SolveSOR
          (TPZSkylMatrix<std::complex<float>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<float>_> *F,TPZFMatrix<std::complex<float>_> *result,
          TPZFMatrix<std::complex<float>_> *residual,TPZFMatrix<std::complex<float>_> *scratch,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  long lVar1;
  undefined8 uVar2;
  _ComplexT _Var3;
  long lVar4;
  complex<float> **ppcVar5;
  complex<float> *pcVar6;
  long lVar7;
  int iVar8;
  undefined4 extraout_var;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  complex<float> *pcVar13;
  undefined8 *puVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  complex<float> *pcVar18;
  long lVar19;
  long lVar20;
  float __x;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined8 uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  double local_130;
  long local_a8;
  
  if (residual == F) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZMatrix::SolveSOR called with residual and F equal, no solution\n",0x42);
    return;
  }
  if (residual == (TPZFMatrix<std::complex<float>_> *)0x0) {
    local_130 = *tol + *tol + 1.0;
  }
  else {
    Dot<std::complex<float>>(residual,residual);
    if (__x < 0.0) {
      fVar21 = sqrtf(__x);
    }
    else {
      fVar21 = SQRT(__x);
    }
    local_130 = (double)fVar21;
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  iVar8 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  lVar10 = CONCAT44(extraout_var,iVar8) + -1;
  lVar15 = 0;
  lVar7 = lVar15;
  if (direction != -1) {
    lVar10 = lVar15;
    lVar7 = CONCAT44(extraout_var,iVar8);
  }
  if ((0 < *numiterations) && (*tol <= local_130 && local_130 != *tol)) {
    fVar21 = (float)overrelax;
    lVar4 = (F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
    lVar1 = (ulong)(direction != -1) * 2 + -1;
    lVar15 = 0;
    do {
      TPZFMatrix<std::complex<float>_>::operator=(scratch,F);
      local_130 = 0.0;
      if (0 < lVar4) {
        local_130 = 0.0;
        local_a8 = 0;
        lVar16 = 0;
        do {
          if (direction == 1) {
            lVar11 = lVar10 * 8 + 8;
            lVar20 = lVar10;
            if (lVar10 != lVar7) {
              do {
                ppcVar5 = (this->fElem).fStore;
                pcVar6 = ppcVar5[lVar20];
                lVar12 = (long)ppcVar5[lVar20 + 1] - (long)pcVar6;
                lVar17 = lVar12 >> 3;
                if (((lVar20 - lVar17 < -1) ||
                    (lVar19 = (scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                              fRow, lVar19 <= (lVar20 - lVar17) + 1)) ||
                   ((scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                    lVar16)) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pcVar18 = scratch->fElem;
                if (((lVar20 < 0) ||
                    (lVar9 = (result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                             fRow, lVar9 <= lVar20)) ||
                   ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                    lVar16)) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                puVar14 = (undefined8 *)((long)(this->fElem).fStore[lVar20] + lVar12 + -8);
                lVar12 = (long)puVar14 - (long)pcVar6 >> 3;
                if (-1 < lVar12) {
                  lVar9 = lVar9 * lVar16;
                  fVar28 = *(float *)&result->fElem[lVar9 + lVar20]._M_value;
                  fVar29 = *(float *)((long)&result->fElem[lVar9 + lVar20]._M_value + 4);
                  lVar19 = lVar19 * local_a8 + lVar11;
                  lVar9 = 0;
                  do {
                    fVar22 = (float)*puVar14;
                    fVar23 = (float)((ulong)*puVar14 >> 0x20);
                    fVar27 = fVar28 * fVar22 - fVar29 * fVar23;
                    fVar26 = fVar28 * fVar23 + fVar29 * fVar22;
                    uVar24 = CONCAT44(fVar26,fVar27);
                    if ((NAN(fVar27)) && (uVar24 = CONCAT44(fVar26,fVar27), NAN(fVar26))) {
                      uVar24 = __mulsc3(fVar22,fVar23);
                    }
                    uVar2 = *(undefined8 *)((long)&pcVar18[lVar9 - lVar17]._M_value + lVar19);
                    *(ulong *)((long)&pcVar18[lVar9 - lVar17]._M_value + lVar19) =
                         CONCAT44((float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar24 >> 0x20),
                                  (float)uVar2 - (float)uVar24);
                    lVar9 = lVar9 + 1;
                    puVar14 = puVar14 + -1;
                  } while (lVar12 + 1 != lVar9);
                }
                lVar20 = lVar20 + lVar1;
                lVar11 = lVar11 + lVar1 * 8;
                lVar12 = lVar10;
              } while (lVar20 != lVar7);
              for (; lVar12 != lVar7; lVar12 = lVar12 + lVar1) {
                ppcVar5 = (this->fElem).fStore;
                lVar11 = (long)ppcVar5[lVar12 + 1] - (long)ppcVar5[lVar12];
                if (((lVar12 < 0) ||
                    (lVar20 = (scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                              fRow, lVar20 <= lVar12)) ||
                   ((scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                    lVar16)) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar17 = lVar11 >> 3;
                _Var3 = scratch->fElem[lVar20 * lVar16 + lVar12]._M_value;
                fVar28 = (float)_Var3;
                fVar29 = (float)(_Var3 >> 0x20);
                lVar20 = (lVar12 - lVar17) + 1;
                if (((lVar12 - lVar17 < -1) ||
                    (lVar17 = (result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                              fRow, lVar17 <= lVar20)) ||
                   ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                    lVar16)) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pcVar6 = (this->fElem).fStore[lVar12];
                pcVar18 = (complex<float> *)((long)pcVar6 + lVar11 + -8);
                if (pcVar6 < pcVar18) {
                  pcVar13 = result->fElem + lVar17 * lVar16 + lVar20;
                  do {
                    fVar22 = (float)pcVar18->_M_value;
                    fVar23 = (float)(pcVar18->_M_value >> 0x20);
                    _Var3 = pcVar13->_M_value;
                    fVar27 = (float)(_Var3 >> 0x20);
                    fVar26 = (float)_Var3 * fVar22 - fVar27 * fVar23;
                    fVar25 = fVar22 * fVar27 + fVar23 * (float)_Var3;
                    uVar24 = CONCAT44(fVar25,fVar26);
                    if ((NAN(fVar26)) && (uVar24 = CONCAT44(fVar25,fVar26), NAN(fVar25))) {
                      uVar24 = __mulsc3(fVar22,fVar23,_Var3,fVar27);
                    }
                    fVar28 = fVar28 - (float)uVar24;
                    fVar29 = fVar29 - (float)((ulong)uVar24 >> 0x20);
                    pcVar13 = pcVar13 + 1;
                    pcVar18 = pcVar18 + -1;
                  } while (pcVar6 < pcVar18);
                }
                fVar22 = fVar28 * fVar28 - fVar29 * fVar29;
                if ((NAN(fVar22)) && (NAN(fVar29 * fVar28 + fVar29 * fVar28))) {
                  fVar22 = (float)__mulsc3();
                }
                fVar22 = cabsf(fVar22);
                fVar23 = fVar28 * fVar21 - fVar29 * 0.0;
                fVar26 = fVar29 * fVar21 + fVar28 * 0.0;
                uVar24 = CONCAT44(fVar26,fVar23);
                if ((NAN(fVar23)) && (uVar24 = CONCAT44(fVar26,fVar23), NAN(fVar26))) {
                  uVar24 = __mulsc3(fVar28,fVar29);
                }
                uVar24 = __divsc3((int)uVar24,(int)((ulong)uVar24 >> 0x20));
                if (((lVar12 < 0) ||
                    (lVar11 = (result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                              fRow, lVar11 <= lVar12)) ||
                   ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                    lVar16)) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_130 = local_130 + (double)fVar22;
                lVar11 = lVar11 * lVar16;
                _Var3 = result->fElem[lVar11 + lVar12]._M_value;
                result->fElem[lVar11 + lVar12]._M_value =
                     CONCAT44((float)((ulong)uVar24 >> 0x20) + (float)(_Var3 >> 0x20),
                              (float)uVar24 + (float)_Var3);
              }
            }
          }
          else {
            lVar11 = lVar10;
            if (lVar10 != lVar7) {
              do {
                ppcVar5 = (this->fElem).fStore;
                lVar20 = (long)ppcVar5[lVar11 + 1] - (long)ppcVar5[lVar11];
                if (((lVar11 < 0) ||
                    (lVar12 = (scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                              fRow, lVar12 <= lVar11)) ||
                   ((scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                    lVar16)) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar17 = lVar20 >> 3;
                _Var3 = scratch->fElem[lVar12 * lVar16 + lVar11]._M_value;
                fVar28 = (float)_Var3;
                fVar29 = (float)(_Var3 >> 0x20);
                lVar12 = (lVar11 - lVar17) + 1;
                if (((lVar11 - lVar17 < -1) ||
                    (lVar17 = (result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                              fRow, lVar17 <= lVar12)) ||
                   ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                    lVar16)) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pcVar6 = (this->fElem).fStore[lVar11];
                pcVar18 = (complex<float> *)((long)pcVar6 + lVar20 + -8);
                if (pcVar6 < pcVar18) {
                  pcVar13 = result->fElem + lVar17 * lVar16 + lVar12;
                  do {
                    fVar23 = (float)pcVar18->_M_value;
                    fVar26 = (float)(pcVar18->_M_value >> 0x20);
                    fVar22 = *(float *)((long)&pcVar13->_M_value + 4);
                    fVar27 = *(float *)&pcVar13->_M_value * fVar23 - fVar26 * fVar22;
                    fVar22 = *(float *)&pcVar13->_M_value * fVar26 + fVar23 * fVar22;
                    uVar24 = CONCAT44(fVar22,fVar27);
                    if ((NAN(fVar27)) && (uVar24 = CONCAT44(fVar22,fVar27), NAN(fVar22))) {
                      uVar24 = __mulsc3(fVar23,fVar26);
                    }
                    fVar28 = fVar28 - (float)uVar24;
                    fVar29 = fVar29 - (float)((ulong)uVar24 >> 0x20);
                    pcVar18 = pcVar18 + -1;
                    pcVar13 = pcVar13 + 1;
                  } while (pcVar6 < pcVar18);
                }
                if (((lVar11 < 0) ||
                    (lVar20 = (scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                              fRow, lVar20 <= lVar11)) ||
                   ((scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                    lVar16)) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                scratch->fElem[lVar20 * lVar16 + lVar11]._M_value = CONCAT44(fVar29,fVar28);
                lVar11 = lVar11 + lVar1;
                lVar20 = lVar10;
              } while (lVar11 != lVar7);
              for (; lVar20 != lVar7; lVar20 = lVar20 + lVar1) {
                ppcVar5 = (this->fElem).fStore;
                pcVar6 = ppcVar5[lVar20];
                lVar9 = (long)ppcVar5[lVar20 + 1] - (long)pcVar6;
                lVar17 = lVar9 >> 3;
                lVar19 = (lVar20 - lVar17) + 1;
                lVar11 = (scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
                lVar12 = (scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
                if ((lVar12 <= lVar16 || lVar20 - lVar17 < -1) || lVar11 <= lVar19) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pcVar18 = scratch->fElem;
                if (((lVar20 < 0) || (lVar11 <= lVar20)) || (lVar12 <= lVar16)) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                _Var3 = pcVar18[lVar11 * lVar16 + lVar20]._M_value;
                if (((lVar20 < 0) ||
                    (lVar12 = (result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                              fRow, lVar12 <= lVar20)) ||
                   ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                    lVar16)) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar12 = lVar12 * lVar16;
                fVar22 = (float)pcVar6->_M_value;
                fVar23 = (float)(pcVar6->_M_value >> 0x20);
                fVar28 = *(float *)&result->fElem[lVar12 + lVar20]._M_value;
                fVar29 = *(float *)((long)&result->fElem[lVar12 + lVar20]._M_value + 4);
                fVar26 = fVar28 * fVar22 - fVar23 * fVar29;
                fVar28 = fVar28 * fVar23 + fVar22 * fVar29;
                uVar24 = CONCAT44(fVar28,fVar26);
                if ((NAN(fVar26)) && (uVar24 = CONCAT44(fVar28,fVar26), NAN(fVar28))) {
                  uVar24 = __mulsc3(fVar22,fVar23);
                }
                fVar29 = (float)_Var3 - (float)uVar24;
                fVar22 = (float)(_Var3 >> 0x20) - (float)((ulong)uVar24 >> 0x20);
                fVar28 = fVar29 * fVar29 - fVar22 * fVar22;
                if ((NAN(fVar28)) && (NAN(fVar22 * fVar29 + fVar22 * fVar29))) {
                  fVar28 = (float)__mulsc3();
                }
                fVar28 = cabsf(fVar28);
                fVar23 = fVar29 * fVar21 - fVar22 * 0.0;
                fVar29 = fVar22 * fVar21 + fVar29 * 0.0;
                uVar24 = CONCAT44(fVar29,fVar23);
                if ((NAN(fVar23)) && (uVar24 = CONCAT44(fVar29,fVar23), NAN(fVar29))) {
                  uVar24 = __mulsc3(fVar21,0);
                }
                uVar24 = __divsc3((int)uVar24,(int)((ulong)uVar24 >> 0x20));
                if (((lVar20 < 0) ||
                    (lVar12 = (result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                              fRow, lVar12 <= lVar20)) ||
                   ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                    lVar16)) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar12 = lVar12 * lVar16;
                _Var3 = result->fElem[lVar12 + lVar20]._M_value;
                result->fElem[lVar12 + lVar20]._M_value =
                     CONCAT44((float)((ulong)uVar24 >> 0x20) + (float)(_Var3 >> 0x20),
                              (float)uVar24 + (float)_Var3);
                if (((lVar20 < 0) ||
                    (lVar12 = (result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.
                              fRow, lVar12 <= lVar20)) ||
                   ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                    lVar16)) {
                  TPZFMatrix<std::complex<float>_>::Error
                            ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                pcVar13 = (complex<float> *)((long)(this->fElem).fStore[lVar20] + lVar9 + -8);
                if (pcVar6 < pcVar13) {
                  pcVar18 = pcVar18 + lVar11 * lVar16 + lVar19;
                  _Var3 = result->fElem[lVar12 * lVar16 + lVar20]._M_value;
                  fVar29 = (float)_Var3;
                  fVar22 = (float)(_Var3 >> 0x20);
                  do {
                    fVar23 = (float)pcVar13->_M_value;
                    fVar26 = (float)(pcVar13->_M_value >> 0x20);
                    fVar25 = fVar29 * fVar23 - fVar22 * fVar26;
                    fVar27 = fVar29 * fVar26 + fVar22 * fVar23;
                    uVar24 = CONCAT44(fVar27,fVar25);
                    if ((NAN(fVar25)) && (uVar24 = CONCAT44(fVar27,fVar25), NAN(fVar27))) {
                      uVar24 = __mulsc3(fVar23,fVar26);
                    }
                    pcVar18->_M_value =
                         CONCAT44((float)(pcVar18->_M_value >> 0x20) -
                                  (float)((ulong)uVar24 >> 0x20),
                                  (float)pcVar18->_M_value - (float)uVar24);
                    pcVar18 = pcVar18 + 1;
                    pcVar13 = pcVar13 + -1;
                  } while (pcVar6 < pcVar13);
                }
                local_130 = local_130 + (double)fVar28;
              }
            }
          }
          lVar16 = lVar16 + 1;
          local_a8 = local_a8 + 8;
        } while (lVar16 != lVar4);
      }
      if (local_130 < 0.0) {
        local_130 = sqrt(local_130);
      }
      else {
        local_130 = SQRT(local_130);
      }
      lVar15 = lVar15 + 1;
    } while ((lVar15 < *numiterations) && (*tol <= local_130 && local_130 != *tol));
  }
  if (residual != (TPZFMatrix<std::complex<float>_> *)0x0) {
    (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x28])(this,result,F);
  }
  *numiterations = lVar15;
  *tol = local_130;
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SolveSOR(int64_t & numiterations,const TPZFMatrix<TVar> &F,
                                   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch,const REAL overrelax,
                                   REAL &tol,const int FromCurrent,const int direction)  {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	REAL res = 2.*tol+1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
    TVar over = overrelax;
	int64_t r = this->Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	if(direction == -1) {
		ifirst = r-1;
		ilast = 0;
		iinc = -1;
	}
	int64_t it;
	for(it=0; it<numiterations && res > tol; it++) {
		res = 0.;
		scratch = F;
		for(int64_t ic=0; ic<c; ic++) {
			if(direction == 1) {
				//
				// compute the upper triangular part first and put into the scractch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val;
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					int64_t lastid = diag-diaglast;
					int64_t id;
					for(id=0; id<=lastid; id++) *(scratchp+id) -= *(diag-id) * val;
					/* codeguard fix
					 while( diag >= diaglast ) *scratchp++ -= *diag-- * val;
					 */
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					res += abs(val*val);
					result(i,ic) += val*over/ (*diag);
				}
			} else {
				//
				// the direction is upward
				//
				// put the lower triangular part of the multiplication into the scratch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					//					res += val*val;
					scratch(i,ic) = val;
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					//	TVar val = scratch(i,ic);
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					//val= result(i,ic);
					TVar val = scratch(i,ic);
					val -= *diaglast * result(i,ic);
					res += abs(val*val);
					val = over * val / *diaglast;
					result(i,ic) += val;
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					while( diag > diaglast ) *scratchp++ -= *diag-- * val;
				}
			}
		}
		res = sqrt(res);
	}
	if(residual) {
		this->Residual(result,F,*residual);
	}
	numiterations = it;
	tol = res;
}